

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAML.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jaegertracing::utils::yaml::findOrDefault<std::__cxx11::string,char[20],char[1]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,yaml *this,Node *node,char (*key) [20],char (*defaultValue) [1])

{
  Node valueNode;
  allocator local_39;
  Node local_38;
  
  YAML::Node::operator[]<char[20]>(&local_38,(Node *)this,&node->m_isValid);
  if ((local_38.m_isValid == true) &&
     ((local_38.m_pNode == (node *)0x0 || (*(char *)**(undefined8 **)local_38.m_pNode != '\0')))) {
    YAML::Node::as<std::__cxx11::string>(__return_storage_ptr__,&local_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,*key,&local_39);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.m_pMemory.
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

ValueType findOrDefault(const YAML::Node& node,
                        const KeyType& key,
                        const DefaultValueType& defaultValue)
{
    const auto valueNode = node[key];
    if (!valueNode.IsDefined()) {
        return defaultValue;
    }
    return valueNode.template as<ValueType>();
}